

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

bool __thiscall TextField::update(TextField *this,int mouseX,int mouseY,bool clicked)

{
  Transformable *this_00;
  Text *this_01;
  Vector2f VVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  Vector2f *pVVar5;
  String *this_02;
  size_t sVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float local_38;
  FloatRect local_30;
  
  if ((((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') &&
      ((this->isEditable & 1U) != 0)) && (clicked)) {
    this_00 = &(this->super_UIComponent).super_Transformable;
    pVVar5 = sf::Transformable::getPosition(this_00);
    fVar9 = pVVar5->x;
    pVVar5 = sf::Transformable::getPosition(this_00);
    fVar8 = pVVar5->y;
    local_30 = sf::Shape::getGlobalBounds(&(this->background).super_Shape);
    fVar9 = (float)(mouseX - (int)fVar9);
    bVar3 = sf::Rect<float>::contains(&local_30,fVar9,(float)(mouseY - (int)fVar8));
    if (bVar3) {
      this_01 = &this->field;
      uVar4 = 0;
      local_38 = 3.4028235e+38;
      uVar7 = 0;
      while( true ) {
        this_02 = sf::Text::getString(this_01);
        sVar6 = sf::String::getSize(this_02);
        if (sVar6 < uVar4) break;
        VVar1 = sf::Text::findCharacterPos(this_01,(ulong)uVar4);
        fVar8 = ABS(fVar9 - VVar1.x);
        uVar2 = uVar4;
        if (local_38 <= fVar8) {
          fVar8 = local_38;
          uVar2 = uVar7;
        }
        uVar7 = uVar2;
        uVar4 = uVar4 + 1;
        local_38 = fVar8;
      }
      this->caretPosition = uVar7;
      VVar1 = sf::Text::findCharacterPos(this_01,(long)(int)uVar7);
      sf::Transformable::setPosition(&(this->caret).super_Shape.super_Transformable,VVar1.x,2.0);
      this->selected = true;
    }
    else if (this->selected == true) {
      this->selected = false;
    }
  }
  return false;
}

Assistant:

bool TextField::update(int mouseX, int mouseY, bool clicked) {
    if (visible && isEditable && clicked) {
        mouseX -= static_cast<int>(getPosition().x);
        mouseY -= static_cast<int>(getPosition().y);
        if (background.getGlobalBounds().contains(static_cast<float>(mouseX), static_cast<float>(mouseY))) {
            unsigned int closestIndex = 0;
            float closestDistance = numeric_limits<float>::max();
            for (unsigned int i = 0; i <= field.getString().getSize(); ++i) {
                float distance = fabs(mouseX - field.findCharacterPos(i).x);
                if (distance < closestDistance) {
                    closestIndex = i;
                    closestDistance = distance;
                }
            }
            caretPosition = closestIndex;
            caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
            selected = true;
        } else if (selected) {
            selected = false;
        }
    }
    return false;
}